

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_geometric.cpp
# Opt level: O1

void __thiscall Vector::Scale(Vector *this,float scale)

{
  float fVar1;
  float fVar2;
  
  fVar1 = this->m_vec[1];
  fVar2 = this->m_vec[2];
  this->m_vec[0] = this->m_vec[0] * scale;
  this->m_vec[1] = fVar1 * scale;
  this->m_vec[2] = scale * fVar2;
  this->m_length = -1.0;
  return;
}

Assistant:

void Vector::Scale(float scale)
{
   float x, y, z;

   x = X() * scale;
   y = Y() * scale;
   z = Z() * scale;

   Set(x, y, z);
}